

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_input.hpp
# Opt level: O1

void __thiscall tao::pegtl::internal::mmap_holder::~mmap_holder(mmap_holder *this)

{
  pointer pcVar1;
  
  munmap((this->data).m_data,(this->data).m_size);
  pcVar1 = (this->filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~mmap_holder() = default;